

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  int iVar1;
  ZSTD_freeFunction p_Var2;
  ZSTD_allocFunction p_Var3;
  BYTE *src;
  ZSTD_dStage ZVar4;
  ZSTD_nextInputType_e ZVar5;
  char *pcVar6;
  ZSTD_DDict *pZVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  size_t sVar16;
  char *oend;
  void *local_d0;
  char *local_c8;
  ZSTD_inBuffer *local_c0;
  void *local_b8;
  ZSTD_frameHeader *local_b0;
  BYTE *local_a8;
  char *local_a0;
  ulong local_98;
  ulong local_90;
  void *local_88;
  size_t *local_80;
  ZSTD_outBuffer *local_78;
  void *local_70;
  ulong local_68;
  ulong local_60;
  ZSTD_outBuffer *local_58;
  size_t local_50;
  ZSTD_frameSizeInfo frameSizeInfo;
  
  local_70 = input->src;
  local_60 = input->size;
  local_68 = input->pos;
  pvVar14 = output->dst;
  local_90 = output->size;
  local_98 = output->pos;
  local_c8 = (char *)((long)pvVar14 + local_98);
  sVar11 = 0xffffffffffffffb8;
  local_50 = local_60 - local_68;
  if (local_68 <= local_60) {
    if (local_90 < local_98) {
LAB_0074b13f:
      sVar11 = 0xffffffffffffffba;
    }
    else if (((zds->outBufferMode != ZSTD_bm_stable) || (zds->streamStage == zdss_init)) ||
            ((sVar11 = 0xffffffffffffff98, (zds->expectedOutBuffer).dst == pvVar14 &&
             (((zds->expectedOutBuffer).pos == local_98 &&
              ((zds->expectedOutBuffer).size == local_90)))))) {
      local_88 = (void *)((long)local_70 + local_68);
      local_b8 = (void *)(local_60 + (long)local_70);
      oend = (char *)((long)pvVar14 + local_90);
      local_78 = &zds->expectedOutBuffer;
      local_80 = &zds->outStart;
      local_b0 = &zds->fParams;
      local_a8 = zds->headerBuffer;
      pcVar8 = local_c8;
      local_c0 = input;
      local_a0 = local_c8;
      local_58 = output;
      local_d0 = local_88;
      do {
        while( true ) {
          while (zds->streamStage == zdss_flush) {
            sVar11 = zds->outStart;
            uVar12 = zds->outEnd - sVar11;
            uVar15 = (long)oend - (long)pcVar8;
            uVar13 = uVar12;
            if (uVar15 < uVar12) {
              uVar13 = uVar15;
            }
            if (uVar13 != 0) {
              memcpy(pcVar8,zds->outBuff + sVar11,uVar13);
              sVar11 = zds->outStart;
            }
            pcVar6 = pcVar8 + uVar13;
            if (pcVar8 == (char *)0x0) {
              pcVar6 = pcVar8;
            }
            *local_80 = sVar11 + uVar13;
            pvVar14 = local_d0;
            if (uVar15 < uVar12) goto LAB_0074b7f4;
            zds->streamStage = zdss_read;
            pcVar8 = pcVar6;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < sVar11 + uVar13 + (ulong)(zds->fParams).blockSizeMax)) {
              *local_80 = 0;
              local_80[1] = 0;
            }
          }
          local_c8 = pcVar8;
          switch(zds->streamStage) {
          case zdss_init:
            zds->streamStage = zdss_loadHeader;
            zds->inPos = 0;
            *(undefined8 *)((long)local_80 + 0xc) = 0;
            *(undefined8 *)((long)local_80 + 0x14) = 0;
            *local_80 = 0;
            local_80[1] = 0;
            local_78->pos = local_58->pos;
            sVar11 = local_58->size;
            local_78->dst = local_58->dst;
            local_78->size = sVar11;
            sVar11 = 0;
            break;
          case zdss_loadHeader:
            sVar11 = zds->lhSize;
            break;
          case zdss_read:
            goto LAB_0074b63f;
          case zdss_load:
            uVar13 = zds->expected;
            ZVar4 = zds->stage;
            uVar12 = (long)local_b8 - (long)local_d0;
            uVar9 = ZVar4 - ZSTDds_decompressBlock;
            goto LAB_0074b6b4;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x8f2,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          sVar11 = ZSTD_getFrameHeader_advanced(local_b0,local_a8,sVar11,zds->format);
          if ((zds->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
             (zds->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
            ZSTD_DCtx_selectFrameDDict(zds);
          }
          sVar16 = local_50;
          src = local_a8;
          pcVar8 = local_c8;
          if (0xffffffffffffff88 < sVar11) {
            return sVar11;
          }
          if (sVar11 == 0) break;
          uVar13 = (long)local_b8 - (long)local_d0;
          if (local_b8 < local_d0) {
            __assert_fail("iend >= ip",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x842,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          sVar16 = zds->lhSize;
          uVar15 = sVar11 - sVar16;
          if (uVar13 < uVar15) {
            if (local_b8 != local_d0) {
              memcpy(local_a8 + sVar16,local_d0,uVar13);
              sVar16 = uVar13 + zds->lhSize;
              zds->lhSize = sVar16;
            }
            local_c0->pos = local_c0->size;
            sVar16 = ZSTD_getFrameHeader_advanced(local_b0,src,sVar16,zds->format);
            if (sVar16 < 0xffffffffffffff89) {
              uVar13 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
              if (sVar11 < uVar13) {
                sVar11 = uVar13;
              }
              return (sVar11 - zds->lhSize) + 3;
            }
            return sVar16;
          }
          if (local_d0 == (void *)0x0) {
            __assert_fail("ip != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x850,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          memcpy(local_a8 + sVar16,local_d0,uVar15);
          zds->lhSize = sVar11;
LAB_0074b77c:
          local_d0 = (void *)((long)local_d0 + uVar15);
          pcVar8 = local_c8;
        }
        if ((((local_b0->frameContentSize != 0xffffffffffffffff) &&
             ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
            (uVar13 = (long)oend - (long)local_c8, local_b0->frameContentSize <= uVar13)) &&
           (ZSTD_findFrameSizeInfo(&frameSizeInfo,local_88,local_50),
           frameSizeInfo.compressedSize <= sVar16)) {
          pZVar7 = ZSTD_getDDict(zds);
          sVar11 = ZSTD_decompressMultiFrame
                             (zds,pcVar8,uVar13,local_88,frameSizeInfo.compressedSize,(void *)0x0,0,
                              pZVar7);
          if (0xffffffffffffff88 < sVar11) {
            return sVar11;
          }
          if (local_70 == (void *)0x0) {
            __assert_fail("istart != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x85f,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          local_d0 = (void *)(frameSizeInfo.compressedSize + (long)local_88);
          local_c8 = pcVar8 + sVar11;
          if (pcVar8 == (char *)0x0) {
            local_c8 = pcVar8;
          }
          zds->expected = 0;
LAB_0074b93e:
          zds->streamStage = zdss_init;
          pvVar14 = local_d0;
          pcVar6 = local_c8;
          goto LAB_0074b7f4;
        }
        if (((zds->outBufferMode == ZSTD_bm_stable) &&
            ((zds->fParams).frameType != ZSTD_skippableFrame)) &&
           ((local_b0->frameContentSize != 0xffffffffffffffff &&
            ((ulong)((long)oend - (long)local_c8) < local_b0->frameContentSize))))
        goto LAB_0074b13f;
        pZVar7 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar7);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar13 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar4 = ZSTDds_skipFrame;
        }
        else {
          sVar11 = ZSTD_decodeFrameHeader(zds,local_a8,zds->lhSize);
          if (0xffffffffffffff88 < sVar11) {
            return sVar11;
          }
          ZVar4 = ZSTDds_decodeBlockHeader;
          uVar13 = 3;
        }
        zds->expected = uVar13;
        zds->stage = ZVar4;
        uVar13 = (zds->fParams).windowSize;
        if (uVar13 < 0x401) {
          uVar13 = 0x400;
        }
        (zds->fParams).windowSize = uVar13;
        if (zds->maxWindowSize < uVar13) {
          return 0xfffffffffffffff0;
        }
        uVar9 = (zds->fParams).blockSizeMax;
        if (uVar9 < 5) {
          uVar9 = 4;
        }
        uVar12 = (ulong)uVar9;
        if (zds->outBufferMode == ZSTD_bm_buffered) {
          uVar15 = 0x20000;
          if (uVar13 < 0x20000) {
            uVar15 = uVar13;
          }
          uVar15 = uVar13 + uVar15 + 0x20040;
          uVar13 = local_b0->frameContentSize;
          if (uVar15 < local_b0->frameContentSize) {
            uVar13 = uVar15;
          }
        }
        else {
          uVar13 = 0;
        }
        uVar15 = uVar12 + uVar13;
        if (zds->outBuffSize + zds->inBuffSize < uVar15 * 3) {
          uVar10 = 0;
        }
        else {
          uVar10 = zds->oversizedDuration + 1;
        }
        zds->oversizedDuration = uVar10;
        if ((zds->inBuffSize < uVar12) || (0x7f < uVar10 || zds->outBuffSize < uVar13)) {
          uVar10 = zds->staticSize;
          if (uVar10 == 0) {
            pcVar8 = zds->inBuff;
            if (pcVar8 != (char *)0x0) {
              p_Var2 = (zds->customMem).customFree;
              if (p_Var2 == (ZSTD_freeFunction)0x0) {
                free(pcVar8);
              }
              else {
                (*p_Var2)((zds->customMem).opaque,pcVar8);
              }
            }
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            p_Var3 = (zds->customMem).customAlloc;
            if (p_Var3 == (ZSTD_allocFunction)0x0) {
              pcVar8 = (char *)malloc(uVar15);
            }
            else {
              pcVar8 = (char *)(*p_Var3)((zds->customMem).opaque,uVar15);
            }
            zds->inBuff = pcVar8;
            if (pcVar8 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (uVar10 < 0x176e0) {
              __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x898,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            if (uVar10 - 0x176e0 < uVar15) {
              return 0xffffffffffffffc0;
            }
            pcVar8 = zds->inBuff;
          }
          zds->inBuffSize = uVar12;
          zds->outBuff = pcVar8 + uVar12;
          zds->outBuffSize = uVar13;
        }
        zds->streamStage = zdss_read;
LAB_0074b63f:
        uVar12 = (long)local_b8 - (long)local_d0;
        ZVar4 = zds->stage;
        uVar9 = ZVar4 - ZSTDds_decompressBlock;
        if (uVar9 < 2) {
          uVar13 = zds->expected;
          if (zds->bType != bt_raw) goto LAB_0074b685;
          uVar15 = uVar12;
          if (uVar13 < uVar12) {
            uVar15 = uVar13;
          }
          uVar15 = uVar15 + (uVar15 == 0);
        }
        else {
          uVar13 = zds->expected;
LAB_0074b685:
          uVar15 = uVar13;
          if (uVar13 == 0) goto LAB_0074b93e;
        }
        if (uVar15 <= uVar12) {
          sVar11 = ZSTD_decompressContinueStream(zds,&local_c8,oend,local_d0,uVar15);
          if (0xffffffffffffff88 < sVar11) {
            return sVar11;
          }
          if (local_d0 == (void *)0x0) {
            __assert_fail("ip != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x8b5,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          goto LAB_0074b77c;
        }
        pvVar14 = local_b8;
        pcVar6 = local_c8;
        if (local_d0 == local_b8) goto LAB_0074b7f4;
        zds->streamStage = zdss_load;
LAB_0074b6b4:
        sVar11 = zds->inPos;
        if ((uVar9 < 2) && (zds->bType == bt_raw)) {
          uVar15 = uVar12;
          if (uVar13 < uVar12) {
            uVar15 = uVar13;
          }
          if (uVar13 != uVar15 + (uVar15 == 0)) {
            __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                          ,0x8c4,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
        }
        uVar15 = uVar13 - sVar11;
        if (ZVar4 == ZSTDds_skipFrame) {
          if (uVar15 < uVar12) {
            uVar12 = uVar15;
          }
          if (uVar12 != 0) goto LAB_0074b73a;
LAB_0074b789:
          uVar12 = 0;
        }
        else {
          if (zds->inBuffSize - sVar11 < uVar15) {
            return 0xffffffffffffffec;
          }
          if (uVar15 < uVar12) {
            uVar12 = uVar15;
          }
          if (uVar12 == 0) goto LAB_0074b789;
          memcpy(zds->inBuff + sVar11,local_d0,uVar12);
          sVar11 = zds->inPos;
LAB_0074b73a:
          local_d0 = (void *)((long)local_d0 + uVar12);
          zds->inPos = sVar11 + uVar12;
        }
        pvVar14 = local_d0;
        pcVar6 = local_c8;
        if (uVar12 < uVar15) {
LAB_0074b7f4:
          local_c8 = pcVar6;
          local_c0->pos = (long)pvVar14 - (long)local_c0->src;
          sVar11 = (long)local_c8 - (long)local_58->dst;
          local_58->pos = sVar11;
          local_78->pos = sVar11;
          sVar11 = local_58->size;
          local_78->dst = local_58->dst;
          local_78->size = sVar11;
          if (local_a0 == local_c8 && local_88 == pvVar14) {
            iVar1 = zds->noForwardProgress;
            zds->noForwardProgress = iVar1 + 1;
            if (0xe < iVar1) {
              if (local_98 == local_90) {
                return 0xffffffffffffffb0;
              }
              if (local_60 != local_68) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                              ,0x902,
                              "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                             );
              }
              return 0xffffffffffffffae;
            }
          }
          else {
            zds->noForwardProgress = 0;
          }
          sVar11 = zds->expected;
          if (sVar11 != 0) {
            ZVar5 = ZSTD_nextInputType(zds);
            uVar13 = (ulong)(ZVar5 == ZSTDnit_block) * 3 + sVar11;
            if (uVar13 < zds->inPos) {
              __assert_fail("zds->inPos <= nextSrcSizeHint",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                            ,0x91b,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            return uVar13 - zds->inPos;
          }
          if (zds->outEnd != zds->outStart) {
            if (zds->hostageByte == 0) {
              local_c0->pos = local_c0->pos - 1;
              zds->hostageByte = 1;
              return 1;
            }
            return 1;
          }
          if (zds->hostageByte != 0) {
            if (local_c0->size <= local_c0->pos) {
              zds->streamStage = zdss_read;
              return 1;
            }
            local_c0->pos = local_c0->pos + 1;
          }
          return 0;
        }
        zds->inPos = 0;
        sVar11 = ZSTD_decompressContinueStream(zds,&local_c8,oend,zds->inBuff,uVar13);
        pcVar8 = local_c8;
      } while (sVar11 < 0xffffffffffffff89);
    }
  }
  return sVar11;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            zds->legacyVersion = 0;
#endif
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            ZSTD_FALLTHROUGH;

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        /* check first few bytes */
                        FORWARD_IF_ERROR(
                            ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format),
                            "First few bytes detected incorrect" );
                        /* return hint input size */
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    assert(istart != NULL);
                    ip = istart + cSize;
                    op = op ? op + decompressedSize : op; /* can occur if frameContentSize = 0 (empty frame) */
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            ZSTD_FALLTHROUGH;

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    assert(ip != NULL);
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            ZSTD_FALLTHROUGH;

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip)));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                if (loadedSize != 0) {
                    /* ip may be NULL */
                    ip += loadedSize;
                    zds->inPos += loadedSize;
                }
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {
                size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);

                op = op ? op + flushedSize : op;

                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                        && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, noForwardProgress_destFull, "");
            RETURN_ERROR_IF(ip==iend, noForwardProgress_inputEmpty, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}